

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O0

bool r_exec::_Fact::MatchObject(Code *lhs,Code *rhs)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  uint16_t lhs_opcode;
  Code *rhs_local;
  Code *lhs_local;
  
  iVar3 = (*(lhs->super__Object)._vptr__Object[5])(lhs,0);
  iVar4 = (*(rhs->super__Object)._vptr__Object[5])(rhs,0);
  uVar5 = r_code::Atom::operator!=
                    ((Atom *)CONCAT44(extraout_var,iVar3),(Atom *)CONCAT44(extraout_var_00,iVar4));
  if ((uVar5 & 1) == 0) {
    (*(lhs->super__Object)._vptr__Object[5])();
    sVar2 = r_code::Atom::asOpcode();
    if ((((sVar2 == Opcodes::Ent) || (sVar2 == Opcodes::Ont)) || (sVar2 == Opcodes::Mdl)) ||
       (sVar2 == Opcodes::Cst)) {
      lhs_local._7_1_ = lhs == rhs;
    }
    else {
      (*(lhs->super__Object)._vptr__Object[5])();
      bVar1 = r_code::Atom::getAtomCount();
      lhs_local._7_1_ = Match(lhs,0,1,rhs,1,(ushort)bVar1);
    }
  }
  else {
    lhs_local._7_1_ = false;
  }
  return lhs_local._7_1_;
}

Assistant:

bool _Fact::MatchObject(const Code *lhs, const Code *rhs)
{
    if (lhs->code(0) != rhs->code(0)) {
        return false;
    }

    uint16_t lhs_opcode = lhs->code(0).asOpcode();

    if (lhs_opcode == Opcodes::Ent ||
        lhs_opcode == Opcodes::Ont ||
        lhs_opcode == Opcodes::Mdl ||
        lhs_opcode == Opcodes::Cst) {
        return lhs == rhs;
    }

    return Match(lhs, 0, 1, rhs, 1, lhs->code(0).getAtomCount());
}